

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMetaDataSetMetaData(FmsMetaData mdata,char *mdata_name,FmsInt size,FmsMetaData **data)

{
  int iVar1;
  FmsMetaData *__ptr;
  FmsMetaData pFVar2;
  ulong uVar3;
  bool bVar4;
  char *local_40;
  
  if (mdata == (FmsMetaData)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = FmsMetaDataClear(mdata);
    if (iVar1 == 0) {
      if (mdata_name == (char *)0x0) {
        bVar4 = true;
        local_40 = (char *)0x0;
      }
      else {
        local_40 = strdup(mdata_name);
        bVar4 = local_40 != (char *)0x0;
      }
      iVar1 = 2;
      if (bVar4) {
        if (size == 0) {
          __ptr = (FmsMetaData *)0x0;
        }
        else {
          __ptr = (FmsMetaData *)malloc(size * 8);
        }
        if (size == 0 || __ptr != (FmsMetaData *)0x0) {
          uVar3 = 0;
          do {
            if (size <= uVar3) {
              mdata->name = local_40;
              mdata->md_type = FMS_META_DATA;
              mdata->num_entries = size;
              mdata->data = __ptr;
              *data = __ptr;
              return 0;
            }
            pFVar2 = (FmsMetaData)calloc(1,0x20);
            if (pFVar2 == (FmsMetaData)0x0) {
              for (; uVar3 != 0; uVar3 = uVar3 - 1) {
                free(__ptr[uVar3 - 1]);
              }
              free(__ptr);
              free(local_40);
              uVar3 = 1;
            }
            else {
              __ptr[uVar3] = pFVar2;
              uVar3 = uVar3 + 1;
            }
          } while (pFVar2 != (FmsMetaData)0x0);
        }
        else {
          free(local_40);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsMetaDataSetMetaData(FmsMetaData mdata, const char *mdata_name,
                           FmsInt size, FmsMetaData **data) {
  if (!mdata) { E_RETURN(1); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  char *name_copy;
  if (FmsCopyString(mdata_name, &name_copy)) { E_RETURN(2); }
  // On error, call free(name_copy)
  FmsMetaData *md_data = size ? malloc(size*sizeof(*md_data)) : NULL;
  if (size && md_data == NULL) { free(name_copy); E_RETURN(2); }
  // On error, call free(md_data)
  for (FmsInt i = 0; i < size; i++) {
    FmsMetaData md;
    md = calloc(1, sizeof(*md));
    if (md == NULL) {
      while (i != 0) { free(md_data[--i]); }
      free(md_data);
      free(name_copy);
      E_RETURN(2);
    }
    md_data[i] = md;
  }
  // Update mdata
  mdata->name = name_copy;
  mdata->md_type = FMS_META_DATA;
  mdata->num_entries = size;
  mdata->data = md_data;
  *data = md_data;
  return 0;
}